

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_write_header(p_ply ply)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  p_ply_element ptVar4;
  long lVar5;
  long lVar6;
  
  if (((ply == (p_ply)0x0) || ((FILE *)ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_WRITE)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25d,"int ply_write_header(p_ply)");
  }
  if (ply->element == (p_ply_element)0x0) {
    if (ply->nelements != 0) {
      __assert_fail("ply->element || ply->nelements == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x25e,"int ply_write_header(p_ply)");
    }
  }
  else if (ply->nelements < 1) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x25f,"int ply_write_header(p_ply)");
  }
  iVar1 = fprintf((FILE *)ply->fp,"ply\nformat %s 1.0\n",ply_storage_mode_list[ply->storage_mode]);
  if (0 < iVar1) {
    lVar5 = -1;
    lVar3 = 0;
    do {
      lVar5 = lVar5 + 1;
      if (ply->ncomments <= lVar5) {
        lVar5 = -1;
        lVar3 = 0;
        goto LAB_001156a2;
      }
      iVar1 = fprintf((FILE *)ply->fp,"comment %s\n",ply->comment + lVar3);
      lVar3 = lVar3 + 0x400;
    } while (0 < iVar1);
  }
  goto LAB_001156cb;
  while( true ) {
    iVar1 = fprintf((FILE *)ply->fp,"obj_info %s\n",ply->obj_info + lVar3);
    lVar3 = lVar3 + 0x400;
    if (iVar1 < 1) break;
LAB_001156a2:
    lVar5 = lVar5 + 1;
    if (ply->nobj_infos <= lVar5) {
      lVar5 = 0;
      while( true ) {
        if (ply->nelements <= lVar5) {
          iVar1 = fprintf((FILE *)ply->fp,"end_header\n");
          return (uint)(0 < iVar1);
        }
        ptVar4 = ply->element;
        if (ptVar4[lVar5].property == (p_ply_property)0x0) {
          if (ptVar4[lVar5].nproperties != 0) {
            __assert_fail("element->property || element->nproperties == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                          ,0x26a,"int ply_write_header(p_ply)");
          }
        }
        else if (ptVar4[lVar5].nproperties < 1) {
          __assert_fail("!element->property || element->nproperties > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                        ,0x26b,"int ply_write_header(p_ply)");
        }
        ptVar4 = ptVar4 + lVar5;
        iVar1 = fprintf((FILE *)ply->fp,"element %s %ld\n",ptVar4);
        if (iVar1 < 1) break;
        lVar3 = 0;
        for (lVar6 = 0; lVar6 < ptVar4->nproperties; lVar6 = lVar6 + 1) {
          uVar2 = (ulong)*(uint *)((long)&ptVar4->property->type + lVar3);
          if (uVar2 == 0x10) {
            iVar1 = fprintf((FILE *)ply->fp,"property list %s %s %s\n",
                            ply_type_list[*(uint *)((long)&ptVar4->property->length_type + lVar3)]);
          }
          else {
            iVar1 = fprintf((FILE *)ply->fp,"property %s %s\n",ply_type_list[uVar2]);
          }
          if (iVar1 < 1) goto LAB_001156cb;
          lVar3 = lVar3 + 0x128;
        }
        lVar5 = lVar5 + 1;
      }
      break;
    }
  }
LAB_001156cb:
  ply_ferror(ply,"Error writing to file");
  return 0;
}

Assistant:

int ply_write_header(p_ply ply) {
    long i, j;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    if (fprintf(ply->fp, "ply\nformat %s 1.0\n",
                ply_storage_mode_list[ply->storage_mode]) <= 0) goto error;
    for (i = 0; i < ply->ncomments; i++)
        if (fprintf(ply->fp, "comment %s\n", ply->comment + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nobj_infos; i++)
        if (fprintf(ply->fp, "obj_info %s\n", ply->obj_info + LINESIZE*i) <= 0)
            goto error;
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        assert(element->property || element->nproperties == 0);
        assert(!element->property || element->nproperties > 0);
        if (fprintf(ply->fp, "element %s %ld\n", element->name,
                    element->ninstances) <= 0) goto error;
        for (j = 0; j < element->nproperties; j++) {
            p_ply_property property = &element->property[j];
            if (property->type == PLY_LIST) {
                if (fprintf(ply->fp, "property list %s %s %s\n",
                            ply_type_list[property->length_type],
                            ply_type_list[property->value_type],
                            property->name) <= 0) goto error;
            } else {
                if (fprintf(ply->fp, "property %s %s\n",
                            ply_type_list[property->type],
                            property->name) <= 0) goto error;
            }
        }
    }
    return fprintf(ply->fp, "end_header\n") > 0;
error:
    ply_ferror(ply, "Error writing to file");
    return 0;
}